

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.cpp
# Opt level: O2

Ref<Lodtalk::ByteString> *
Lodtalk::ByteString::fromNative
          (Ref<Lodtalk::ByteString> *__return_storage_ptr__,VMContext *context,string *native)

{
  ObjectHeader *pOVar1;
  
  pOVar1 = (ObjectHeader *)basicNativeNew(context,native->_M_string_length);
  memcpy(pOVar1 + 1,(native->_M_dataplus)._M_p,native->_M_string_length);
  OopRef::OopRef(&__return_storage_ptr__->reference,context);
  (__return_storage_ptr__->reference).oop.field_0.header = pOVar1;
  return __return_storage_ptr__;
}

Assistant:

Ref<ByteString> ByteString::fromNative(VMContext *context, const std::string &native)
{
	auto result = basicNativeNew(context, native.size());
	memcpy(result->getFirstFieldPointer(), native.data(), native.size());
	return Ref<ByteString> (context, reinterpret_cast<ByteString*> (result));
}